

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void dumpfile(char *filename,void *data,size_t len)

{
  FILE *__s;
  size_t sVar1;
  
  __s = fopen(filename,"wb");
  if (__s != (FILE *)0x0) {
    sVar1 = fwrite(data,1,len,__s);
    if ((long)sVar1 < (long)len) {
      logprintf("Can\'t write file %s\n",filename);
    }
    fclose(__s);
    return;
  }
  logprintf("Can\'t open file %s for writing\n",filename);
  return;
}

Assistant:

void
dumpfile(const char *filename, void *data, size_t len)
{
	ssize_t bytes_written;
	FILE *f;

	f = fopen(filename, "wb");
	if (f == NULL) {
		logprintf("Can't open file %s for writing\n", filename);
		return;
	}
	bytes_written = fwrite(data, 1, len, f);
	if (bytes_written < (ssize_t)len)
		logprintf("Can't write file %s\n", filename);
	fclose(f);
}